

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_short,10u>,Counter<unsigned_char,8u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Counter<unsigned_short,_10U> fullOriginal;
  uint uVar7;
  ushort uVar8;
  uint recent;
  uint uVar9;
  ushort uVar10;
  bool bVar11;
  
  iVar6 = 0;
  bVar11 = false;
  uVar7 = 0;
  do {
    uVar3 = (ushort)uVar7;
    uVar1 = uVar3 & 0xff;
    uVar9 = 0;
    uVar4 = uVar7;
    do {
      if (uVar9 < uVar7) {
        iVar5 = 7;
        if ((int)uVar4 < 0x80 - bias) {
LAB_001022ed:
          uVar2 = (ushort)uVar9;
          uVar10 = uVar2 & 0x100 | uVar1;
          uVar8 = uVar2 & 0xff;
          if (uVar8 < uVar1) {
            if ((ushort)(0x80 - bias) <= (ushort)(uVar1 - uVar8)) {
              uVar10 = uVar10 + 0x300 & 0x3ff;
            }
          }
          else if ((ushort)(bias + 0x80) < (ushort)(uVar8 - uVar1)) {
            uVar10 = uVar10 + 0x100;
          }
          iVar5 = 1;
          if ((uVar10 == uVar3) && ((bias != 0 || (((short)(char)uVar4 + uVar2 & 0x3ff) == uVar3))))
          {
            iVar5 = 0;
          }
        }
      }
      else {
        if ((int)(iVar6 + uVar9) <= bias + 0x80) goto LAB_001022ed;
        iVar5 = 7;
      }
      if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_00102386;
      uVar9 = uVar9 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar9 != 0x200);
    iVar5 = 5;
LAB_00102386:
    if ((iVar5 != 5) && (iVar5 != 0)) {
      return bVar11;
    }
    bVar11 = 0x1fe < uVar7;
    uVar7 = uVar7 + 1;
    iVar6 = iVar6 + -1;
    if (uVar7 == 0x200) {
      return bVar11;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}